

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcStrash.c
# Opt level: O1

Abc_Ntk_t * Abc_NtkRestrashRandom(Abc_Ntk_t *pNtk)

{
  ulong uVar1;
  int iVar2;
  Abc_Ntk_t *pNtk_00;
  int *piVar3;
  Vec_Ptr_t *pVVar4;
  Abc_Ntk_t *pAVar5;
  int iVar6;
  long lVar7;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcStrash.c"
                  ,0x8f,"Abc_Ntk_t *Abc_NtkRestrashRandom(Abc_Ntk_t *)");
  }
  iVar2 = Abc_NtkGetChoiceNum(pNtk);
  if (iVar2 != 0) {
    puts("Warning: The choice nodes in the original AIG are removed by strashing.");
  }
  pNtk_00 = Abc_NtkStartFrom(pNtk,ABC_NTK_STRASH,ABC_FUNC_AIG);
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    iVar2 = pNtk->vObjs->nSize;
    uVar1 = (long)iVar2 + 500;
    iVar6 = (int)uVar1;
    if ((pNtk->vTravIds).nCap < iVar6) {
      piVar3 = (int *)malloc(uVar1 * 4);
      (pNtk->vTravIds).pArray = piVar3;
      if (piVar3 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pNtk->vTravIds).nCap = iVar6;
    }
    if (-500 < iVar2) {
      memset((pNtk->vTravIds).pArray,0,(uVar1 & 0xffffffff) << 2);
    }
    (pNtk->vTravIds).nSize = iVar6;
  }
  iVar2 = pNtk->nTravIds;
  pNtk->nTravIds = iVar2 + 1;
  if (iVar2 < 0x3fffffff) {
    pVVar4 = pNtk->vCos;
    if (0 < pVVar4->nSize) {
      lVar7 = 0;
      do {
        Abc_NtkRestrashRandom_rec
                  (pNtk_00,*(Abc_Obj_t **)
                            (*(long *)(*(long *)(*pVVar4->pArray[lVar7] + 0x20) + 8) +
                            (long)**(int **)((long)pVVar4->pArray[lVar7] + 0x20) * 8));
        lVar7 = lVar7 + 1;
        pVVar4 = pNtk->vCos;
      } while (lVar7 < pVVar4->nSize);
    }
    Abc_NtkFinalize(pNtk,pNtk_00);
    if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
      pAVar5 = Abc_NtkDup(pNtk->pExdc);
      pNtk_00->pExdc = pAVar5;
    }
    iVar2 = Abc_NtkCheck(pNtk_00);
    if (iVar2 == 0) {
      puts("Abc_NtkStrash: The network check has failed.");
      Abc_NtkDelete(pNtk_00);
      pNtk_00 = (Abc_Ntk_t *)0x0;
    }
    return pNtk_00;
  }
  __assert_fail("p->nTravIds < (1<<30)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                ,0x197,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
}

Assistant:

Abc_Ntk_t * Abc_NtkRestrashRandom( Abc_Ntk_t * pNtk )
{
    Abc_Ntk_t * pNtkAig;
    Abc_Obj_t * pObj;
    int i;
    assert( Abc_NtkIsStrash(pNtk) );
    // print warning about choice nodes
    if ( Abc_NtkGetChoiceNum( pNtk ) )
        printf( "Warning: The choice nodes in the original AIG are removed by strashing.\n" );
    // start the new network (constants and CIs of the old network will point to the their counterparts in the new network)
    pNtkAig = Abc_NtkStartFrom( pNtk, ABC_NTK_STRASH, ABC_FUNC_AIG );
    // restrash the nodes (assuming a topological order of the old network)
    Abc_NtkIncrementTravId( pNtk );
    Abc_NtkForEachCo( pNtk, pObj, i )
        Abc_NtkRestrashRandom_rec( pNtkAig, Abc_ObjFanin0(pObj) );
    // finalize the network
    Abc_NtkFinalize( pNtk, pNtkAig );
    // duplicate EXDC 
    if ( pNtk->pExdc )
        pNtkAig->pExdc = Abc_NtkDup( pNtk->pExdc );
    // make sure everything is okay
    if ( !Abc_NtkCheck( pNtkAig ) )
    {
        printf( "Abc_NtkStrash: The network check has failed.\n" );
        Abc_NtkDelete( pNtkAig );
        return NULL;
    }
    return pNtkAig;

}